

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall wasm::Literal::splatI16x8(Literal *__return_storage_ptr__,Literal *this)

{
  long lVar1;
  Literal *this_00;
  undefined1 local_e8 [8];
  LaneArray<8> lanes;
  
  if ((this->type).id == 2) {
    lVar1 = 0;
    memset(local_e8,0,0xc0);
    do {
      this_00 = (Literal *)(local_e8 + lVar1);
      if (this_00 != this) {
        ~Literal(this_00);
        Literal(this_00,this);
      }
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0xc0);
    Literal(__return_storage_ptr__,(LaneArray<8> *)local_e8);
    lVar1 = 0xa8;
    do {
      ~Literal((Literal *)(local_e8 + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
    return __return_storage_ptr__;
  }
  __assert_fail("val.type == Ty",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                ,0x683,"Literal wasm::splat(const Literal &) [Ty = wasm::Type::i32, Lanes = 8]");
}

Assistant:

Literal Literal::splatI16x8() const { return splat<Type::i32, 8>(*this); }